

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::FundAmountMapData,_cfd::js::api::FundAmountMapDataStruct>::
ConvertToStruct(vector<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::FundAmountMapData,_cfd::js::api::FundAmountMapDataStruct>
               *this)

{
  bool bVar1;
  undefined1 local_b8 [8];
  FundAmountMapDataStruct data;
  FundAmountMapData *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::js::api::json::FundAmountMapData,_cfd::js::api::FundAmountMapDataStruct>
  *__range3;
  JsonObjectVector<cfd::js::api::json::FundAmountMapData,_cfd::js::api::FundAmountMapDataStruct>
  *this_local;
  vector<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
  *result;
  
  std::
  vector<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           vector<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>
           ::begin(&(this->super_JsonVector<cfd::js::api::json::FundAmountMapData>).
                    super_vector<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>
                  );
  element = (FundAmountMapData *)
            std::
            vector<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>
            ::end(&(this->super_JsonVector<cfd::js::api::json::FundAmountMapData>).
                   super_vector<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>
                 );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cfd::js::api::json::FundAmountMapData_*,_std::vector<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>_>
                                     *)&element), bVar1) {
    data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_cfd::js::api::json::FundAmountMapData_*,_std::vector<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>_>
                 ::operator*(&__end0);
    js::api::json::FundAmountMapData::ConvertToStruct
              ((FundAmountMapDataStruct *)local_b8,
               (FundAmountMapData *)
               data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<cfd::js::api::FundAmountMapDataStruct,_std::allocator<cfd::js::api::FundAmountMapDataStruct>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_b8);
    js::api::FundAmountMapDataStruct::~FundAmountMapDataStruct((FundAmountMapDataStruct *)local_b8);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::json::FundAmountMapData_*,_std::vector<cfd::js::api::json::FundAmountMapData,_std::allocator<cfd::js::api::json::FundAmountMapData>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }